

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void vmaDestroyVirtualBlock(VmaVirtualBlock virtualBlock)

{
  long in_RDI;
  VkAllocationCallbacks allocationCallbacks;
  VmaVirtualBlock_T *in_stack_ffffffffffffffc8;
  VkAllocationCallbacks *in_stack_ffffffffffffffd0;
  
  if (in_RDI != 0) {
    memcpy(&stack0xffffffffffffffc8,(void *)(in_RDI + 8),0x30);
    vma_delete<VmaVirtualBlock_T>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyVirtualBlock(VmaVirtualBlock VMA_NULLABLE virtualBlock)
{
    if(virtualBlock != VK_NULL_HANDLE)
    {
        VMA_DEBUG_LOG("vmaDestroyVirtualBlock");
        VMA_DEBUG_GLOBAL_MUTEX_LOCK;
        VkAllocationCallbacks allocationCallbacks = virtualBlock->m_AllocationCallbacks; // Have to copy the callbacks when destroying.
        vma_delete(&allocationCallbacks, virtualBlock);
    }
}